

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_COMMAND_AUDIT_INFO_Unmarshal(TPMS_COMMAND_AUDIT_INFO *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_COMMAND_AUDIT_INFO *target_local;
  
  target_local._4_4_ = UINT64_Unmarshal(&target->auditCounter,buffer,size);
  if (((target_local._4_4_ == 0) &&
      (target_local._4_4_ = UINT16_Unmarshal(&target->digestAlg,buffer,size),
      target_local._4_4_ == 0)) &&
     (target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->auditDigest,buffer,size),
     target_local._4_4_ == 0)) {
    target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->commandDigest,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_COMMAND_AUDIT_INFO_Unmarshal(TPMS_COMMAND_AUDIT_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->auditCounter), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)&(target->digestAlg), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->auditDigest), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->commandDigest), buffer, size);
    return result;
}